

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VtabSavepoint(sqlite3 *db,int op,int iSavepoint)

{
  VTable *pVTab_00;
  sqlite3_module *psVar1;
  ulong uVar2;
  uint uVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  u64 savedFlags;
  _func_int_sqlite3_vtab_ptr_int *xMethod;
  sqlite3_module *pMod;
  VTable *pVTab;
  int i;
  int rc;
  int iVar4;
  uint in_stack_ffffffffffffffc4;
  _func_int_sqlite3_vtab_ptr_int *local_30;
  int local_18;
  int local_14;
  
  local_14 = 0;
  if (*(long *)(in_RDI + 0x240) != 0) {
    local_18 = 0;
    while( true ) {
      uVar3 = in_stack_ffffffffffffffc4 & 0xffffff;
      if (local_14 == 0) {
        uVar3 = CONCAT13(local_18 < *(int *)(in_RDI + 0x21c),(int3)in_stack_ffffffffffffffc4);
      }
      in_stack_ffffffffffffffc4 = uVar3;
      if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') break;
      pVTab_00 = *(VTable **)(*(long *)(in_RDI + 0x240) + (long)local_18 * 8);
      psVar1 = pVTab_00->pMod->pModule;
      if ((pVTab_00->pVtab != (sqlite3_vtab *)0x0) && (1 < psVar1->iVersion)) {
        sqlite3VtabLock(pVTab_00);
        if (in_ESI == 0) {
          local_30 = psVar1->xSavepoint;
          pVTab_00->iSavepoint = in_EDX + 1;
        }
        else if (in_ESI == 2) {
          local_30 = psVar1->xRollbackTo;
        }
        else {
          local_30 = psVar1->xRelease;
        }
        iVar4 = in_ESI;
        if ((local_30 != (_func_int_sqlite3_vtab_ptr_int *)0x0) && (in_EDX < pVTab_00->iSavepoint))
        {
          uVar2 = *(ulong *)(in_RDI + 0x30);
          *(ulong *)(in_RDI + 0x30) = *(ulong *)(in_RDI + 0x30) & 0xffffffffefffffff;
          local_14 = (*local_30)(pVTab_00->pVtab,in_EDX);
          *(ulong *)(in_RDI + 0x30) = uVar2 & 0x10000000 | *(ulong *)(in_RDI + 0x30);
        }
        sqlite3VtabUnlock((VTable *)CONCAT44(in_stack_ffffffffffffffc4,iVar4));
      }
      local_18 = local_18 + 1;
    }
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabSavepoint(sqlite3 *db, int op, int iSavepoint){
  int rc = SQLITE_OK;

  assert( op==SAVEPOINT_RELEASE||op==SAVEPOINT_ROLLBACK||op==SAVEPOINT_BEGIN );
  assert( iSavepoint>=-1 );
  if( db->aVTrans ){
    int i;
    for(i=0; rc==SQLITE_OK && i<db->nVTrans; i++){
      VTable *pVTab = db->aVTrans[i];
      const sqlite3_module *pMod = pVTab->pMod->pModule;
      if( pVTab->pVtab && pMod->iVersion>=2 ){
        int (*xMethod)(sqlite3_vtab *, int);
        sqlite3VtabLock(pVTab);
        switch( op ){
          case SAVEPOINT_BEGIN:
            xMethod = pMod->xSavepoint;
            pVTab->iSavepoint = iSavepoint+1;
            break;
          case SAVEPOINT_ROLLBACK:
            xMethod = pMod->xRollbackTo;
            break;
          default:
            xMethod = pMod->xRelease;
            break;
        }
        if( xMethod && pVTab->iSavepoint>iSavepoint ){
          u64 savedFlags = (db->flags & SQLITE_Defensive);
          db->flags &= ~(u64)SQLITE_Defensive;
          rc = xMethod(pVTab->pVtab, iSavepoint);
          db->flags |= savedFlags;
        }
        sqlite3VtabUnlock(pVTab);
      }
    }
  }
  return rc;
}